

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_handshake_api(void)

{
  int iVar1;
  ptls_t *ppVar2;
  void **ppvVar3;
  size_t local_7e8;
  size_t inlen;
  undefined1 local_760 [16];
  uint8_t *local_750;
  size_t local_748;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr **local_740;
  undefined1 local_6e0 [16];
  uint8_t *local_6d0;
  size_t local_6c8;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr **local_6c0;
  undefined1 local_660 [8];
  ptls_handshake_properties_t server_hs_prop;
  undefined1 local_560 [8];
  ptls_handshake_properties_t client_hs_prop;
  size_t max_early_data_size;
  code *pcStack_4d0;
  int ret;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  ptls_update_traffic_key_t update_traffic_key;
  size_t soffs [5];
  size_t local_488;
  size_t coffs [5];
  undefined1 local_458 [8];
  ptls_buffer_t sbuf;
  ptls_buffer_t cbuf;
  traffic_secrets_t server_secrets;
  traffic_secrets_t client_secrets;
  ptls_t *server;
  ptls_t *client;
  
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  encrypt_ticket.cb = on_update_traffic_key;
  save_ticket.cb = on_copy_ticket;
  pcStack_4d0 = on_save_ticket;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)&encrypt_ticket;
  ctx->field_0xb8 = ctx->field_0xb8 & 0xef | 0x10;
  ctx->save_ticket = (ptls_save_ticket_t *)&stack0xfffffffffffffb30;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)&encrypt_ticket;
  ctx_peer->field_0xb8 = ctx_peer->field_0xb8 & 0xef | 0x10;
  ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)&save_ticket;
  ctx_peer->ticket_lifetime = 0x15180;
  ctx_peer->max_early_data_size = 0x2000;
  memset(saved_tickets,0,0x80);
  ptls_buffer_init((ptls_buffer_t *)&sbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)local_458,"",0);
  ppVar2 = ptls_new(ctx,0);
  ppvVar3 = ptls_get_data_ptr(ppVar2);
  *ppvVar3 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar3 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar3 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x749);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x74b);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x74c);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x74d);
  iVar1 = memcmp(server_secrets[1][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x74e);
  iVar1 = memcmp(server_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x74f);
  iVar1 = memcmp(server_secrets[0][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x750);
  iVar1 = memcmp(server_secrets[0][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x751);
  iVar1 = feed_messages(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x753);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x754);
  iVar1 = ptls_handshake_is_complete(ppVar2);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x755);
  iVar1 = memcmp(client_secrets[0][1] + 0x38,server_secrets[1][1] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x756);
  iVar1 = memcmp(client_secrets[1][1] + 0x38,server_secrets[0][1] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x757);
  iVar1 = memcmp(client_secrets[0][2] + 0x38,server_secrets[1][2] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x758);
  iVar1 = memcmp(client_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x759);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x75b);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x75c);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x75d);
  iVar1 = memcmp(client_secrets[1][2] + 0x38,server_secrets[0][2] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x75e);
  ptls_free(ppVar2);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  memset(&update_traffic_key,0,0x28);
  ctx->save_ticket = (ptls_save_ticket_t *)0x0;
  client_hs_prop.collected_extensions =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
  memset(local_560,0,0x80);
  client_hs_prop.field_0.client.negotiated_protocols.count = (size_t)saved_tickets[0].base;
  client_hs_prop.field_0.client.session_ticket.base = (uint8_t *)saved_tickets[0].len;
  client_hs_prop.field_0.client.session_ticket.len = (size_t)&client_hs_prop.collected_extensions;
  ppVar2 = ptls_new(ctx,0);
  ppvVar3 = ptls_get_data_ptr(ppVar2);
  *ppvVar3 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar3 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar3 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x774);
  _ok((uint)(client_hs_prop.collected_extensions !=
            (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0)
      ,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x775);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x776);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x778);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x779);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x77a);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,server_secrets[0][0] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x77b);
  iVar1 = memcmp(server_secrets[0][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x77c);
  iVar1 = memcmp(server_secrets[1][1] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x77d);
  iVar1 = memcmp(server_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x77e);
  iVar1 = memcmp(server_secrets[0][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x77f);
  iVar1 = feed_messages(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x781);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x782);
  iVar1 = ptls_handshake_is_complete(ppVar2);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x783);
  iVar1 = memcmp(client_secrets[0][2] + 0x38,server_secrets[1][2] + 0x38,0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x784);
  iVar1 = memcmp(client_secrets[1][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x785);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x787);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x788);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x789);
  iVar1 = memcmp(server_secrets[0][2] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x78a);
  ptls_free(ppVar2);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  memset(&update_traffic_key,0,0x28);
  ctx_peer->max_early_data_size = 0;
  memset(&server_hs_prop.collected_extensions,0,0x80);
  memcpy(local_560,&server_hs_prop.collected_extensions,0x80);
  ppVar2 = ptls_new(ctx,0);
  ppvVar3 = ptls_get_data_ptr(ppVar2);
  *ppvVar3 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar3 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar3 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x79e);
  _ok((uint)(client_hs_prop.collected_extensions !=
            (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0)
      ,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x79f);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a0);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a2);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a3);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a4);
  iVar1 = feed_messages(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a6);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a7);
  iVar1 = ptls_handshake_is_complete(ppVar2);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x7a8);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7a9);
  iVar1 = memcmp(server_secrets[0][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7aa);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7ac);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7ad);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x7ae);
  ptls_free(ppVar2);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  memset(server_secrets[1][3] + 0x38,0,0x200);
  memset(&cbuf.is_allocated,0,0x200);
  memset(&local_488,0,0x28);
  memset(&update_traffic_key,0,0x28);
  ctx_peer->max_early_data_size = 0x2000;
  memset(local_660,0,0x80);
  server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ =
       server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ & 0xfe | 1;
  memset(local_6e0,0,0x80);
  local_6d0 = saved_tickets[0].base;
  local_6c8 = saved_tickets[0].len;
  local_6c0 = &client_hs_prop.collected_extensions;
  memcpy(local_560,local_6e0,0x80);
  ppVar2 = ptls_new(ctx,0);
  ppvVar3 = ptls_get_data_ptr(ppVar2);
  *ppvVar3 = server_secrets[1][3] + 0x38;
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  ppvVar3 = ptls_get_data_ptr((ptls_t *)client_secrets[1][3]._56_8_);
  *ppvVar3 = &cbuf.is_allocated;
  iVar1 = ptls_handle_message(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7c4);
  _ok((uint)(client_hs_prop.collected_extensions !=
            (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0)
      ,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7c5);
  iVar1 = memcmp(client_secrets[1][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7c6);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)local_660);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7c8);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7c9);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7ca);
  iVar1 = feed_messages(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7cc);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7cd);
  iVar1 = ptls_handshake_is_complete(ppVar2);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7ce);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",1999);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)local_660);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7d1);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7d2);
  iVar1 = memcmp(server_secrets[0][0] + 0x38,"",0x40);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7d3);
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7d4);
  iVar1 = feed_messages(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,&local_488,(uint8_t *)local_458,
                        (size_t *)&update_traffic_key,(ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7d6);
  iVar1 = ptls_handshake_is_complete(ppVar2);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x7d7);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7d8);
  iVar1 = feed_messages((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                        (size_t *)&update_traffic_key,(uint8_t *)sbuf._24_8_,&local_488,
                        (ptls_handshake_properties_t *)local_660);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7da);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x7db);
  ptls_free(ppVar2);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  cbuf.capacity = 0;
  sbuf.capacity = 0;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx->field_0xb8 = ctx->field_0xb8 & 0xef;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx_peer->field_0xb8 = ctx_peer->field_0xb8 & 0xef;
  memset(local_760,0,0x80);
  local_750 = saved_tickets[0].base;
  local_748 = saved_tickets[0].len;
  local_740 = &client_hs_prop.collected_extensions;
  memcpy(local_560,local_760,0x80);
  memset(&inlen,0,0x80);
  memcpy(local_660,&inlen,0x80);
  server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ =
       server_hs_prop.field_0.server.cookie.additional_data.len._0_1_ & 0xfe | 1;
  ppVar2 = ptls_new(ctx,0);
  client_secrets[1][3]._56_8_ = ptls_new(ctx_peer,1);
  iVar1 = ptls_handshake(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7ee);
  _ok((uint)(client_hs_prop.field_0.client.session_ticket.len != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7ef);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7f0);
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7f1);
  iVar1 = ptls_send(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7f3);
  local_7e8 = cbuf.capacity;
  iVar1 = ptls_handshake((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                         (void *)sbuf._24_8_,&local_7e8,(ptls_handshake_properties_t *)local_660);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7f6);
  _ok((uint)(cbuf.capacity == local_7e8),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7f7);
  cbuf.capacity = 0;
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7f9);
  local_7e8 = sbuf.capacity;
  iVar1 = ptls_handshake(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,(void *)local_458,&local_7e8,
                         (ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7fc);
  _ok((uint)(client_hs_prop.field_0._32_4_ == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7fd);
  _ok((uint)(sbuf.capacity == local_7e8),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x7fe);
  sbuf.capacity = 0;
  _ok((uint)(cbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x800);
  local_7e8 = cbuf.capacity;
  iVar1 = ptls_handshake((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                         (void *)sbuf._24_8_,&local_7e8,(ptls_handshake_properties_t *)local_660);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x803);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x804);
  _ok((uint)(cbuf.capacity == local_7e8),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x805);
  cbuf.capacity = 0;
  _ok((uint)(sbuf.capacity != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x807);
  local_7e8 = sbuf.capacity;
  iVar1 = ptls_handshake(ppVar2,(ptls_buffer_t *)&sbuf.is_allocated,(void *)local_458,&local_7e8,
                         (ptls_handshake_properties_t *)local_560);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x80a);
  iVar1 = ptls_handshake_is_complete(ppVar2);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x80b);
  _ok((uint)(local_7e8 < sbuf.capacity),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x80c);
  sbuf.capacity = 0;
  local_7e8 = cbuf.capacity;
  iVar1 = ptls_handshake((ptls_t *)client_secrets[1][3]._56_8_,(ptls_buffer_t *)local_458,
                         (void *)sbuf._24_8_,&local_7e8,(ptls_handshake_properties_t *)local_660);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x810);
  iVar1 = ptls_handshake_is_complete((ptls_t *)client_secrets[1][3]._56_8_);
  _ok(iVar1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
      0x811);
  _ok((uint)(sbuf.capacity == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x812);
  ptls_free(ppVar2);
  ptls_free((ptls_t *)client_secrets[1][3]._56_8_);
  ptls_buffer_dispose((ptls_buffer_t *)&sbuf.is_allocated);
  ptls_buffer_dispose((ptls_buffer_t *)local_458);
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx->field_0xb8 = ctx->field_0xb8 & 0xef;
  ctx->save_ticket = (ptls_save_ticket_t *)0x0;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctx_peer->field_0xb8 = ctx_peer->field_0xb8 & 0xef;
  ctx_peer->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ctx_peer->save_ticket = (ptls_save_ticket_t *)0x0;
  ctx_peer->ticket_lifetime = 0;
  ctx_peer->max_early_data_size = 0;
  return;
}

Assistant:

static void test_handshake_api(void)
{
    ptls_t *client, *server;
    traffic_secrets_t client_secrets = {{{0}}}, server_secrets = {{{0}}};
    ptls_buffer_t cbuf, sbuf;
    size_t coffs[5] = {0}, soffs[5];
    ptls_update_traffic_key_t update_traffic_key = {on_update_traffic_key};
    ptls_encrypt_ticket_t encrypt_ticket = {on_copy_ticket};
    ptls_save_ticket_t save_ticket = {on_save_ticket};
    int ret;

    ctx->update_traffic_key = &update_traffic_key;
    ctx->omit_end_of_early_data = 1;
    ctx->save_ticket = &save_ticket;
    ctx_peer->update_traffic_key = &update_traffic_key;
    ctx_peer->omit_end_of_early_data = 1;
    ctx_peer->encrypt_ticket = &encrypt_ticket;
    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;

    memset(saved_tickets, 0, sizeof(saved_tickets));

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);

    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;

    /* full handshake */
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][2], server_secrets[1][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][2], server_secrets[0][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][3], server_secrets[0][3], PTLS_MAX_DIGEST_SIZE) == 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    ctx->save_ticket = NULL; /* don't allow further test to update the saved ticket */

    /* 0-RTT resumption */
    size_t max_early_data_size = 0;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, saved_tickets[0], &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][1], server_secrets[0][1], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0); /* !!!overlap!!! */
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* 0-RTT rejection */
    ctx_peer->max_early_data_size = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_tickets[0], &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* HRR rejects 0-RTT */
    ctx_peer->max_early_data_size = 8192;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_tickets[0], &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* HRR  -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);
    ok(!ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> SH..SF */
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ok(sbuf.off != 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(cbuf.off != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CF -> */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;

    /* shamelessly reuse this subtest for testing ordinary TLS 0-RTT with HRR rejection */
    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_tickets[0], &max_early_data_size}}};
    server_hs_prop = (ptls_handshake_properties_t){{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.max_early_data_size != 0);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
    ok(cbuf.off != 0);
    ret = ptls_send(client, &cbuf, "hello world", 11); /* send 0-RTT data that'll be rejected */
    ok(ret == 0);
    size_t inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* HRR -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(sbuf.off == inlen);
    sbuf.off = 0;
    ok(cbuf.off != 0);
    inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> SH..SF,NST */
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(inlen < sbuf.off); /* ignore NST */
    sbuf.off = 0;
    inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CF -> */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));
    ok(sbuf.off == 0);

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);

    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx->save_ticket = NULL;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx_peer->save_ticket = NULL;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
}